

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O0

value * __thiscall
mjs::anon_unknown_46::json_str
          (value *__return_storage_ptr__,anon_unknown_46 *this,stringify_state *state,
          wstring_view key,object_ptr *holder)

{
  uint32_t *this_00;
  double dVar1;
  initializer_list<mjs::value> __l;
  bool bVar2;
  value_type vVar3;
  gc_heap *h_00;
  object *poVar4;
  object_ptr *poVar5;
  string *this_01;
  wstring_view wVar6;
  value *local_2a0;
  string local_268;
  undefined1 local_258 [8];
  object_ptr o;
  wstring local_238;
  wstring_view local_218;
  string local_208;
  string local_1f8;
  undefined1 local_1e8 [32];
  undefined1 local_1c8 [64];
  undefined1 local_188 [8];
  object_ptr o_2;
  allocator<mjs::value> local_15a;
  undefined1 local_159;
  string local_158;
  value *local_148;
  value local_140;
  iterator local_118;
  undefined1 local_110 [32];
  value local_f0;
  undefined1 local_c8 [8];
  object_ptr to_json;
  undefined1 local_a8 [8];
  value to_json_value;
  undefined1 local_70 [8];
  object_ptr o_1;
  value v;
  gc_heap *h;
  object_ptr *holder_local;
  stringify_state *state_local;
  wstring_view key_local;
  
  key_local._M_len = key._M_len;
  state_local = state;
  key_local._M_str = (wchar_t *)__return_storage_ptr__;
  h_00 = stringify_state::heap((stringify_state *)this);
  poVar4 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)key._M_str);
  (**poVar4->_vptr_object)(&o_1.super_gc_heap_ptr_untyped.pos_,poVar4,&state_local);
  vVar3 = value::type((value *)&o_1.super_gc_heap_ptr_untyped.pos_);
  if (vVar3 == object) {
    poVar5 = value::object_value((value *)&o_1.super_gc_heap_ptr_untyped.pos_);
    gc_heap_ptr<mjs::object>::gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_70,poVar5);
    poVar4 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_70);
    this_00 = &to_json.super_gc_heap_ptr_untyped.pos_;
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)this_00,L"toJSON");
    (**poVar4->_vptr_object)(local_a8,poVar4,this_00);
    vVar3 = value::type((value *)local_a8);
    if (vVar3 == object) {
      poVar5 = value::object_value((value *)local_a8);
      gc_heap_ptr<mjs::object>::gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_c8,poVar5);
      bVar2 = gc_heap_ptr_untyped::has_type<mjs::function_object>((gc_heap_ptr_untyped *)local_c8);
      if (bVar2) {
        local_159 = 1;
        local_148 = &local_140;
        string::string(&local_158,h_00,(wstring_view *)&state_local);
        value::value(&local_140,&local_158);
        local_159 = 0;
        local_118 = &local_140;
        local_110._0_8_ = 4.94065645841247e-324;
        std::allocator<mjs::value>::allocator(&local_15a);
        __l._M_len = local_110._0_8_;
        __l._M_array = local_118;
        std::vector<mjs::value,_std::allocator<mjs::value>_>::vector
                  ((vector<mjs::value,_std::allocator<mjs::value>_> *)(local_110 + 8),__l,&local_15a
                  );
        call_function(&local_f0,(value *)local_a8,(value *)&o_1.super_gc_heap_ptr_untyped.pos_,
                      (vector<mjs::value,_std::allocator<mjs::value>_> *)(local_110 + 8));
        value::operator=((value *)&o_1.super_gc_heap_ptr_untyped.pos_,&local_f0);
        value::~value(&local_f0);
        std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector
                  ((vector<mjs::value,_std::allocator<mjs::value>_> *)(local_110 + 8));
        std::allocator<mjs::value>::~allocator(&local_15a);
        local_2a0 = (value *)&local_118;
        do {
          local_2a0 = local_2a0 + -1;
          value::~value(local_2a0);
        } while (local_2a0 != &local_140);
        string::~string(&local_158);
      }
      gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_c8);
    }
    value::~value((value *)local_a8);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_70);
  }
  o_2.super_gc_heap_ptr_untyped._8_8_ = state_local;
  wVar6._M_str = (wchar_t *)key_local._M_len;
  wVar6._M_len = (size_t)state_local;
  stringify_state::call_replacer
            ((stringify_state *)this,(value *)&o_1.super_gc_heap_ptr_untyped.pos_,wVar6,
             (gc_heap_ptr<mjs::object> *)key._M_str);
  vVar3 = value::type((value *)&o_1.super_gc_heap_ptr_untyped.pos_);
  if (vVar3 == object) {
    poVar5 = value::object_value((value *)&o_1.super_gc_heap_ptr_untyped.pos_);
    gc_heap_ptr<mjs::object>::gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_188,poVar5);
    poVar4 = gc_heap_ptr<mjs::object>::operator*((gc_heap_ptr<mjs::object> *)local_188);
    bVar2 = is_primitive_object(poVar4);
    if (bVar2) {
      poVar4 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_188);
      (*poVar4->_vptr_object[4])(local_1c8 + 0x18);
      value::operator=((value *)&o_1.super_gc_heap_ptr_untyped.pos_,(value *)(local_1c8 + 0x18));
      value::~value((value *)(local_1c8 + 0x18));
    }
    gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_188);
  }
  vVar3 = value::type((value *)&o_1.super_gc_heap_ptr_untyped.pos_);
  switch(vVar3) {
  case undefined:
    value::value(__return_storage_ptr__,(value *)value::undefined);
    local_1c8._20_4_ = 1;
    break;
  case null:
    stringify_state::null_str((stringify_state *)local_1c8);
    value::value(__return_storage_ptr__,(string *)local_1c8);
    string::~string((string *)local_1c8);
    local_1c8._20_4_ = 1;
    break;
  case boolean:
    value::boolean_value((value *)&o_1.super_gc_heap_ptr_untyped.pos_);
    stringify_state::bool_str((stringify_state *)(local_1e8 + 0x10),SUB81(this,0));
    value::value(__return_storage_ptr__,(string *)(local_1e8 + 0x10));
    string::~string((string *)(local_1e8 + 0x10));
    local_1c8._20_4_ = 1;
    break;
  case number:
    dVar1 = value::number_value((value *)&o_1.super_gc_heap_ptr_untyped.pos_);
    bVar2 = std::isfinite(dVar1);
    if (bVar2) {
      dVar1 = value::number_value((value *)&o_1.super_gc_heap_ptr_untyped.pos_);
      to_string((mjs *)&local_1f8,h_00,dVar1);
      value::value(__return_storage_ptr__,&local_1f8);
      string::~string(&local_1f8);
      local_1c8._20_4_ = 1;
    }
    else {
      stringify_state::null_str((stringify_state *)local_1e8);
      value::value(__return_storage_ptr__,(string *)local_1e8);
      string::~string((string *)local_1e8);
      local_1c8._20_4_ = 1;
    }
    break;
  case string:
    this_01 = value::string_value((value *)&o_1.super_gc_heap_ptr_untyped.pos_);
    wVar6 = string::view(this_01);
    o.super_gc_heap_ptr_untyped._8_8_ = wVar6._M_len;
    (anonymous_namespace)::json_quote_abi_cxx11_
              (&local_238,(_anonymous_namespace_ *)&o.super_gc_heap_ptr_untyped.pos_,
               (wstring_view *)wVar6._M_str);
    local_218 = (wstring_view)
                std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_238);
    string::string(&local_208,h_00,&local_218);
    value::value(__return_storage_ptr__,&local_208);
    string::~string(&local_208);
    std::__cxx11::wstring::~wstring((wstring *)&local_238);
    local_1c8._20_4_ = 1;
    break;
  default:
    vVar3 = value::type((value *)&o_1.super_gc_heap_ptr_untyped.pos_);
    if (vVar3 != object) {
      __assert_fail("v.type() == value_type::object",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/json_object.cpp"
                    ,0x2d0,
                    "value mjs::(anonymous namespace)::json_str(stringify_state &, const std::wstring_view, const object_ptr &)"
                   );
    }
    poVar5 = value::object_value((value *)&o_1.super_gc_heap_ptr_untyped.pos_);
    gc_heap_ptr<mjs::object>::gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_258,poVar5);
    bVar2 = gc_heap_ptr_untyped::has_type<mjs::function_object>((gc_heap_ptr_untyped *)local_258);
    if (bVar2) {
      value::value(__return_storage_ptr__,(value *)value::undefined);
    }
    else {
      bVar2 = is_array((object_ptr *)local_258);
      if (bVar2) {
        json_str_array((anon_unknown_46 *)&local_268,(stringify_state *)this,(object_ptr *)local_258
                      );
      }
      else {
        json_str_object((anon_unknown_46 *)&local_268,(stringify_state *)this,
                        (object_ptr *)local_258);
      }
      value::value(__return_storage_ptr__,&local_268);
      string::~string(&local_268);
    }
    local_1c8._20_4_ = 1;
    gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_258);
  }
  value::~value((value *)&o_1.super_gc_heap_ptr_untyped.pos_);
  return __return_storage_ptr__;
}

Assistant:

value json_str(stringify_state& state, const std::wstring_view key, const object_ptr& holder) {
    // ES5.1, 15.12.3 Str(key, holder)
    // May only return a string or undefined

    auto& h = state.heap();
    // 1. Let value be the result of calling the [[Get]] internal method of holder with argument key.
    auto v = holder->get(key);

    // 2. If Type(value) is Object, then
    if (v.type() == value_type::object) {        
        auto o = v.object_value();
        auto to_json_value = o->get(L"toJSON");
        if (to_json_value.type() == value_type::object) {
            if (auto to_json = to_json_value.object_value(); to_json.has_type<function_object>()) {
                v = call_function(to_json_value, v, {value{string{h,key}}});
            }
        }
    }

    // 3. If ReplacerFunction is not undefined, then
    state.call_replacer(v, key, holder);

    // 4. If Type(value) is Object then, 
    if (v.type() == value_type::object) {        
        if (auto o = v.object_value(); is_primitive_object(*o)) {
            v = o->internal_value();
        }
    }

    switch (v.type()) {
    case value_type::undefined:
        return value::undefined;
    case value_type::null:
        return value{state.null_str()};
    case value_type::boolean:
        return value{state.bool_str(v.boolean_value())};
    case value_type::number:
        if (!std::isfinite(v.number_value())) {
            return value{state.null_str()};
        } else {
            return value{to_string(h, v.number_value())};
        }
    case value_type::string:
        return value{string{h, json_quote(v.string_value().view())}};
    default:
        break;
    }
    assert(v.type() == value_type::object);
    const auto o = v.object_value();
    if (o.has_type<function_object>()) {
        return value::undefined;
    } else {
        return value{is_array(o) ? json_str_array(state, o) : json_str_object(state, o) };
    }
}